

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGroup.c
# Opt level: O0

int ddVarGroupCheck(DdManager *table,int x,int y)

{
  int index;
  int iVar1;
  int iVar2;
  int yindex;
  int xindex;
  int y_local;
  int x_local;
  DdManager *table_local;
  
  iVar2 = table->invperm[x];
  index = table->invperm[y];
  iVar1 = Cudd_bddIsVarToBeUngrouped(table,iVar2);
  if (iVar1 == 0) {
    iVar1 = Cudd_bddReadPairIndex(table,iVar2);
    if ((((iVar1 == index) &&
         ((iVar1 = ddIsVarHandled(table,iVar2), iVar1 != 0 ||
          (iVar1 = ddIsVarHandled(table,index), iVar1 != 0)))) &&
        ((iVar2 = Cudd_bddIsVarToBeGrouped(table,iVar2), iVar2 != 0 ||
         (iVar2 = Cudd_bddIsVarToBeGrouped(table,index), iVar2 != 0)))) &&
       (table->keys - table->isolated <= originalSize)) {
      table_local._4_4_ = 1;
    }
    else {
      table_local._4_4_ = 0;
    }
  }
  else {
    table_local._4_4_ = 0;
  }
  return table_local._4_4_;
}

Assistant:

static int
ddVarGroupCheck(
  DdManager * table,
  int x,
  int y)
{
    int xindex = table->invperm[x];
    int yindex = table->invperm[y];

    if (Cudd_bddIsVarToBeUngrouped(table, xindex)) return(0);

    if (Cudd_bddReadPairIndex(table, xindex) == yindex) {
        if (ddIsVarHandled(table, xindex) ||
            ddIsVarHandled(table, yindex)) {
            if (Cudd_bddIsVarToBeGrouped(table, xindex) ||
                Cudd_bddIsVarToBeGrouped(table, yindex) ) {
                if (table->keys - table->isolated <= originalSize) {
                    return(1);
                }
            }
        }
    }

    return(0);

}